

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O1

void __thiscall
LoaderInstance::LoaderInstance
          (LoaderInstance *this,XrInstance instance,XrInstanceCreateInfo *create_info,
          PFN_xrGetInstanceProcAddr topmost_gipa,
          vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
          *api_layer_interfaces)

{
  XrGeneratedDispatchTableCore *__s;
  ulong uVar1;
  allocator local_69;
  LoaderInstance *local_68;
  XrInstance local_60;
  PFN_xrGetInstanceProcAddr local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_LoaderInstance = (_func_int **)&PTR__LoaderInstance_001509d8;
  this->_runtime_instance = instance;
  this->_topmost_gipa = topmost_gipa;
  (this->_enabled_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_enabled_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_enabled_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_api_layer_interfaces).
  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (api_layer_interfaces->
       super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_api_layer_interfaces).
  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (api_layer_interfaces->
       super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->_api_layer_interfaces).
  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (api_layer_interfaces->
       super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (api_layer_interfaces->
  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (api_layer_interfaces->
  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (api_layer_interfaces->
  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = this;
  local_60 = instance;
  local_58 = topmost_gipa;
  __s = (XrGeneratedDispatchTableCore *)operator_new(0x1f8);
  memset(__s,0,0x1f8);
  (this->_dispatch_table)._M_t.
  super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  ._M_t.
  super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
  .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl = __s;
  this->_messenger = (XrDebugUtilsMessengerEXT)0x0;
  if (create_info->enabledExtensionCount != 0) {
    uVar1 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_50,create_info->enabledExtensionNames[uVar1],&local_69);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->_enabled_extensions,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < create_info->enabledExtensionCount);
  }
  GeneratedXrPopulateDispatchTableCore
            ((local_68->_dispatch_table)._M_t.
             super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ._M_t.
             super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
             .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl,local_60,
             local_58);
  return;
}

Assistant:

LoaderInstance::LoaderInstance(XrInstance instance, const XrInstanceCreateInfo* create_info, PFN_xrGetInstanceProcAddr topmost_gipa,
                               std::vector<std::unique_ptr<ApiLayerInterface>> api_layer_interfaces)
    : _runtime_instance(instance),
      _topmost_gipa(topmost_gipa),
      _api_layer_interfaces(std::move(api_layer_interfaces)),
      _dispatch_table(new XrGeneratedDispatchTableCore{}) {
    for (uint32_t ext = 0; ext < create_info->enabledExtensionCount; ++ext) {
        _enabled_extensions.push_back(create_info->enabledExtensionNames[ext]);
    }

    GeneratedXrPopulateDispatchTableCore(_dispatch_table.get(), instance, topmost_gipa);
}